

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall
front::irGenerator::irGenerator::ir_load(irGenerator *this,LeftVal *dest,RightVal *src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  VarId *__p;
  LoadInst *__p_00;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_00;
  undefined1 local_a8 [16];
  undefined1 local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  anon_class_8_1_a78179b7_conflict local_80;
  undefined **local_78;
  undefined1 local_70 [56];
  undefined1 local_38;
  
  __p = (VarId *)operator_new(0x10);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_70 + 0x18),
                    (_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)dest);
  uVar3 = LeftValueToLabelId(this,(LeftVal *)(local_70 + 0x18));
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  __p->id = uVar3;
  local_a8._0_8_ = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::VarId*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),__p);
  uVar2 = local_a8._8_8_;
  uVar1 = local_a8._0_8_;
  local_a8._0_8_ = (_func_int **)0x0;
  local_a8._8_8_ = (_Base_ptr)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[(byte)local_38]._M_data)
            ((anon_class_1_0_00000001 *)&local_80,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_70 + 0x18));
  local_88 = (_Base_ptr)uVar2;
  local_38 = 0xff;
  rightValueToValue((irGenerator *)local_a8,(RightVal *)this);
  uVar2 = local_a8._0_8_;
  local_90 = (_Base_ptr)local_a8._8_8_;
  __p_00 = (LoadInst *)operator_new(0x38);
  local_70[0x10] = *(char *)(uVar2 + 0x18);
  local_80.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)local_70;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)local_70[0x10] + 1]._M_data)
            (&local_80,(variant<int,_mir::inst::VarId> *)(uVar2 + 8));
  local_78 = &PTR_display_001ecf98;
  local_70._17_2_ = *(undefined2 *)(uVar2 + 0x19);
  uVar3 = *(uint32_t *)(uVar1 + 8);
  (__p_00->super_Inst).dest.super_Displayable._vptr_Displayable =
       (_func_int **)&PTR_display_001eb100;
  (__p_00->super_Inst).dest.id = uVar3;
  (__p_00->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ed1c8;
  local_80.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&(__p_00->src).field_0x8;
  (__p_00->src).field_0x18 = local_70[0x10];
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)local_70[0x10] + 1]._M_data)
            (&local_80,(variant<int,_mir::inst::VarId> *)local_70);
  (__p_00->src).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf98;
  (__p_00->src).shift = local_70[0x11];
  (__p_00->src).shift_amount = local_70[0x12];
  local_a8._0_8_ = __p_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::LoadInst*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),__p_00);
  uVar2 = local_a8._8_8_;
  uVar1 = local_a8._0_8_;
  this_00 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&this->_funcNameToInstructions,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  if ((_Base_ptr)uVar2 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(uVar2 + 8) = *(int *)(uVar2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(uVar2 + 8) = *(int *)(uVar2 + 8) + 1;
    }
  }
  local_98 = _S_red;
  local_a8._0_8_ = uVar1;
  local_a8._8_8_ = uVar2;
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_00,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)local_a8);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
    ::_S_vtable._M_arr[(byte)local_98]._M_data)
            ((anon_class_1_0_00000001 *)&local_80,
             (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)local_a8);
  if ((_Base_ptr)uVar2 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
  }
  if (local_90 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90);
  }
  if (local_88 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88);
  }
  return;
}

Assistant:

void irGenerator::ir_load(LeftVal dest, RightVal src) {
  shared_ptr<VarId> destVarId;
  shared_ptr<Value> srcValue;
  shared_ptr<mir::inst::LoadInst> loadInt;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  srcValue = rightValueToValue(src);

  loadInt = shared_ptr<mir::inst::LoadInst>(
      new mir::inst::LoadInst(*srcValue, *destVarId));

  _funcNameToInstructions[_funcStack.back()].push_back(loadInt);
}